

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void __thiscall BufferTest_Append_Test::TestBody(BufferTest_Append_Test *this)

{
  bool bVar1;
  MockSpec<void_(unsigned_long)> *this_00;
  _func_int **pp_Var2;
  AssertionResult gtest_ar;
  mock_buffer<char> buffer;
  char data [15];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  AssertHelper local_d0;
  Matcher<unsigned_long> local_c8;
  basic_buffer<char> local_b0;
  FunctionMockerBase<void_(unsigned_long)> local_90;
  char local_27 [15];
  
  local_b0.capacity_ = 0;
  local_b0.ptr_ = (char *)0x0;
  local_b0.size_ = 0;
  local_b0._vptr_basic_buffer = (_func_int **)&PTR_grow_001d3d08;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&local_90.super_UntypedFunctionMockerBase);
  local_90.current_spec_.matchers_.f0_.super_MatcherBase<unsigned_long>.impl_.value_ =
       (MatcherInterface<unsigned_long> *)0x0;
  local_90.current_spec_.matchers_.f0_.super_MatcherBase<unsigned_long>.impl_.link_.next_ =
       &local_90.current_spec_.matchers_.f0_.super_MatcherBase<unsigned_long>.impl_.link_;
  local_90.current_spec_.matchers_.f0_.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d3be8;
  local_90.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001d4580;
  local_b0.ptr_ = local_27;
  local_b0.capacity_ = 10;
  local_90.current_spec_.function_mocker_ = &local_90;
  fmt::v5::internal::basic_buffer<char>::append<char>
            (&local_b0,"test","waitpid(child_pid_, &status_value, 0)");
  testing::internal::CmpHelperSTREQ((internal *)&local_c8,"test","&buffer[0]","test",local_b0.ptr_);
  if (local_c8.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c8.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var2 = (_func_int **)0x1a06dc;
    }
    else {
      pp_Var2 = ((local_c8.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xbb,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0.data_._0_4_ = 5;
  local_d8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_c8,"5u","buffer.size()",(uint *)&local_d0,(unsigned_long *)&local_d8
            );
  if (local_c8.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c8.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var2 = (_func_int **)0x1a06dc;
    }
    else {
      pp_Var2 = ((local_c8.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xbc,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_b0.capacity_ < 10) {
    (**local_b0._vptr_basic_buffer)(&local_b0,10);
  }
  local_b0.size_ = (size_t)&DAT_0000000a;
  testing::Matcher<unsigned_long>::Matcher(&local_c8,0xc);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&local_90.super_UntypedFunctionMockerBase,&local_b0);
  this_00 = testing::internal::FunctionMocker<void_(unsigned_long)>::With
                      ((FunctionMocker<void_(unsigned_long)> *)&local_90,&local_c8);
  testing::internal::MockSpec<void_(unsigned_long)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0xbe,"buffer","do_grow(12)");
  local_c8.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d3c30;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            (&local_c8.super_MatcherBase<unsigned_long>.impl_);
  fmt::v5::internal::basic_buffer<char>::append<char>(&local_b0,"test","st");
  local_d8.ptr_._0_1_ = 0x74;
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)&local_c8,"\'t\'","buffer[10]",(char *)&local_d8,local_b0.ptr_ + 10);
  if (local_c8.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c8.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var2 = (_func_int **)0x1a06dc;
    }
    else {
      pp_Var2 = ((local_c8.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xc0,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8.ptr_._0_1_ = 0x65;
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)&local_c8,"\'e\'","buffer[11]",(char *)&local_d8,local_b0.ptr_ + 0xb);
  if (local_c8.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c8.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var2 = (_func_int **)0x1a06dc;
    }
    else {
      pp_Var2 = ((local_c8.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xc1,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0.data_._0_4_ = 0xc;
  local_d8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_c8,"12u","buffer.size()",(uint *)&local_d0,
             (unsigned_long *)&local_d8);
  if (local_c8.super_MatcherBase<unsigned_long>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c8.super_MatcherBase<unsigned_long>.impl_.value_ ==
        (MatcherInterface<unsigned_long> *)0x0) {
      pp_Var2 = (_func_int **)0x1a06dc;
    }
    else {
      pp_Var2 = ((local_c8.super_MatcherBase<unsigned_long>.impl_.value_)->
                super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0xc2,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c8.super_MatcherBase<unsigned_long>.impl_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b0._vptr_basic_buffer = (_func_int **)&PTR_grow_001d3d08;
  testing::internal::FunctionMockerBase<void_(unsigned_long)>::~FunctionMockerBase(&local_90);
  return;
}

Assistant:

TEST(BufferTest, Append) {
  char data[15];
  mock_buffer<char> buffer(data, 10);
  const char *test = "test";
  buffer.append(test, test + 5);
  EXPECT_STREQ(test, &buffer[0]);
  EXPECT_EQ(5u, buffer.size());
  buffer.resize(10);
  EXPECT_CALL(buffer, do_grow(12));
  buffer.append(test, test + 2);
  EXPECT_EQ('t', buffer[10]);
  EXPECT_EQ('e', buffer[11]);
  EXPECT_EQ(12u, buffer.size());
}